

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructSet
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructSet *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *this_00;
  const_reference pvVar3;
  Literal *pLVar4;
  element_type *peVar5;
  Literal local_120;
  Literal local_108;
  undefined8 local_f0;
  undefined8 uStack_e8;
  value_type field;
  undefined1 local_d0 [8];
  shared_ptr<wasm::GCData> data;
  Flow value;
  undefined1 local_68 [8];
  Flow ref;
  StructSet *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,pEVar2,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    visit((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
          pEVar2,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x20));
    bVar1 = Flow::breaking((Flow *)&data.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,
                 (Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
    }
    else {
      Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::getGCData();
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d0);
      if (!bVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      local_f0 = ::wasm::Type::getHeapType();
      this_00 = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)::wasm::HeapType::getStruct();
      pvVar3 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                         (this_00,(ulong)*(uint *)(ref.breakTo.super_IString.str._M_str + 0x10));
      uStack_e8 = *(undefined8 *)pvVar3;
      _field = *(undefined8 *)(pvVar3 + 8);
      pLVar4 = Flow::getSingleValue
                         ((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
      ::wasm::Literal::Literal(&local_120,pLVar4);
      truncateForPacking(&local_108,this,&local_120,(Field *)&uStack_e8);
      peVar5 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d0);
      pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                         (&(peVar5->values).super_SmallVector<wasm::Literal,_1UL>,
                          (ulong)*(uint *)(ref.breakTo.super_IString.str._M_str + 0x10));
      ::wasm::Literal::operator=(pLVar4,&local_108);
      ::wasm::Literal::~Literal(&local_108);
      ::wasm::Literal::~Literal(&local_120);
      Flow::Flow(__return_storage_ptr__);
      std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)local_d0);
    }
    Flow::~Flow((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructSet(StructSet* curr) {
    NOTE_ENTER("StructSet");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto field = curr->ref->type.getHeapType().getStruct().fields[curr->index];
    data->values[curr->index] =
      truncateForPacking(value.getSingleValue(), field);
    return Flow();
  }